

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O0

void PlayDramObject(uchar key,int mode,char track)

{
  char track_local;
  int mode_local;
  uchar key_local;
  
  if ((audio_backend_initialised) && (lpSECONDARYBUFFER[track + 0x96] != (AudioBackend_Sound *)0x0))
  {
    switch(mode) {
    case 0:
      AudioBackend_StopSound(lpSECONDARYBUFFER[track + 0x96]);
      AudioBackend_RewindSound(lpSECONDARYBUFFER[track + 0x96]);
      break;
    case 1:
      AudioBackend_StopSound(lpSECONDARYBUFFER[track + 0x96]);
      AudioBackend_RewindSound(lpSECONDARYBUFFER[track + 0x96]);
      ChangeDramFrequency(key,track);
      AudioBackend_PlaySound(lpSECONDARYBUFFER[track + 0x96],false);
      break;
    case 2:
      break;
    case -1:
    }
  }
  return;
}

Assistant:

void PlayDramObject(unsigned char key, int mode, signed char track)
{
	if (!audio_backend_initialised)
		return;

	if (lpSECONDARYBUFFER[150 + track] != NULL)
	{
		switch (mode)
		{
			case 0:	// 停止 (Stop)
				AudioBackend_StopSound(lpSECONDARYBUFFER[150 + track]);
				AudioBackend_RewindSound(lpSECONDARYBUFFER[150 + track]);
				break;

			case 1:	// 再生 (Playback)
				AudioBackend_StopSound(lpSECONDARYBUFFER[150 + track]);
				AudioBackend_RewindSound(lpSECONDARYBUFFER[150 + track]);
				ChangeDramFrequency(key, track);	// 周波数を設定して (Set the frequency)
				AudioBackend_PlaySound(lpSECONDARYBUFFER[150 + track], FALSE);
				break;

			case 2:	// 歩かせ停止 (Stop playback)
				break;

			case -1:
				break;
		}
	}
}